

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockFailureTest.cpp
# Opt level: O0

void __thiscall
TEST_MockFailureTest_MockExpectedObjectDidntHappenFailure_Test::
~TEST_MockFailureTest_MockExpectedObjectDidntHappenFailure_Test
          (TEST_MockFailureTest_MockExpectedObjectDidntHappenFailure_Test *this)

{
  TEST_MockFailureTest_MockExpectedObjectDidntHappenFailure_Test *this_local;
  
  ~TEST_MockFailureTest_MockExpectedObjectDidntHappenFailure_Test(this);
  operator_delete(this,0x48);
  return;
}

Assistant:

TEST(MockFailureTest, MockExpectedObjectDidntHappenFailure)
{
    call1->withName("foo").onObject((void*) 0x02);
    call2->withName("foo").onObject((void*) 0x03);
    call2->callWasMade(1);
    call2->wasPassedToObject();
    call3->withName("unrelated");
    addThreeCallsToList();

    MockExpectedObjectDidntHappenFailure failure(UtestShell::getCurrent(), "foo", *list);
    STRCMP_EQUAL(StringFromFormat(
                 "Mock Failure: Expected call on object for function \"foo\" but it did not happen.\n"
                 "\tEXPECTED calls that WERE NOT fulfilled related to function: foo\n"
                 "\t\t(object address: %p)::foo -> no parameters (expected 1 call, called 0 times)\n"
                 "\tEXPECTED calls that WERE fulfilled related to function: foo\n"
                 "\t\t(object address: %p)::foo -> no parameters (expected 1 call, called 1 time)",
                 (void*) 0x2, (void*) 0x3).asCharString(), failure.getMessage().asCharString());
}